

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int png_image_read_init(png_imagep image)

{
  int iVar1;
  png_controlp ppVar2;
  png_structp png_ptr;
  png_infop info_ptr;
  png_const_structrp local_20;
  png_infop local_18;
  
  if (image->opaque != (png_controlp)0x0) {
    iVar1 = png_image_error(image,"png_image_read: opaque pointer not NULL");
    return iVar1;
  }
  local_20 = png_create_read_struct_2
                       ("1.6.36",image,png_safe_error,png_safe_warning,(png_voidp)0x0,
                        (png_malloc_ptr)0x0,(png_free_ptr)0x0);
  image->opaque = (png_controlp)0x0;
  image->version = 0;
  image->width = 0;
  image->height = 0;
  image->format = 0;
  image->flags = 0;
  image->colormap_entries = 0;
  image->warning_or_error = 0;
  image->message[0] = '\0';
  image->message[1] = '\0';
  image->message[2] = '\0';
  image->message[3] = '\0';
  image->message[4] = '\0';
  image->message[5] = '\0';
  image->message[6] = '\0';
  image->message[7] = '\0';
  image->message[8] = '\0';
  image->message[9] = '\0';
  image->message[10] = '\0';
  image->message[0xb] = '\0';
  image->message[0xc] = '\0';
  image->message[0xd] = '\0';
  image->message[0xe] = '\0';
  image->message[0xf] = '\0';
  image->message[0x10] = '\0';
  image->message[0x11] = '\0';
  image->message[0x12] = '\0';
  image->message[0x13] = '\0';
  image->message[0x14] = '\0';
  image->message[0x15] = '\0';
  image->message[0x16] = '\0';
  image->message[0x17] = '\0';
  image->message[0x18] = '\0';
  image->message[0x19] = '\0';
  image->message[0x1a] = '\0';
  image->message[0x1b] = '\0';
  image->message[0x1c] = '\0';
  image->message[0x1d] = '\0';
  image->message[0x1e] = '\0';
  image->message[0x1f] = '\0';
  image->message[0x20] = '\0';
  image->message[0x21] = '\0';
  image->message[0x22] = '\0';
  image->message[0x23] = '\0';
  image->message[0x24] = '\0';
  image->message[0x25] = '\0';
  image->message[0x26] = '\0';
  image->message[0x27] = '\0';
  image->message[0x28] = '\0';
  image->message[0x29] = '\0';
  image->message[0x2a] = '\0';
  image->message[0x2b] = '\0';
  image->message[0x2c] = '\0';
  image->message[0x2d] = '\0';
  image->message[0x2e] = '\0';
  image->message[0x2f] = '\0';
  image->message[0x30] = '\0';
  image->message[0x31] = '\0';
  image->message[0x32] = '\0';
  image->message[0x33] = '\0';
  image->message[0x34] = '\0';
  image->message[0x35] = '\0';
  image->message[0x36] = '\0';
  image->message[0x37] = '\0';
  image->message[0x38] = '\0';
  image->message[0x39] = '\0';
  image->message[0x3a] = '\0';
  image->message[0x3b] = '\0';
  *(undefined8 *)(image->message + 0x3c) = 0;
  image->version = 1;
  if (local_20 != (png_structp)0x0) {
    local_18 = png_create_info_struct(local_20);
    if (local_18 != (png_infop)0x0) {
      ppVar2 = (png_controlp)png_malloc_warn(local_20,0x30);
      if (ppVar2 != (png_controlp)0x0) {
        ppVar2->size = 0;
        *(undefined8 *)&ppVar2->field_0x28 = 0;
        ppVar2->error_buf = (png_voidp)0x0;
        ppVar2->memory = (png_const_bytep)0x0;
        ppVar2->png_ptr = (png_structp)0x0;
        ppVar2->info_ptr = (png_infop)0x0;
        ppVar2->png_ptr = local_20;
        ppVar2->info_ptr = local_18;
        ppVar2->field_0x28 = ppVar2->field_0x28 & 0xfe;
        image->opaque = ppVar2;
        return 1;
      }
      png_destroy_info_struct(local_20,&local_18);
    }
    png_destroy_read_struct(&local_20,(png_infopp)0x0,(png_infopp)0x0);
  }
  iVar1 = png_image_error(image,"png_image_read: out of memory");
  return iVar1;
}

Assistant:

static int
png_image_read_init(png_imagep image)
{
   if (image->opaque == NULL)
   {
      png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, image,
          png_safe_error, png_safe_warning);

      /* And set the rest of the structure to NULL to ensure that the various
       * fields are consistent.
       */
      memset(image, 0, (sizeof *image));
      image->version = PNG_IMAGE_VERSION;

      if (png_ptr != NULL)
      {
         png_infop info_ptr = png_create_info_struct(png_ptr);

         if (info_ptr != NULL)
         {
            png_controlp control = png_voidcast(png_controlp,
                png_malloc_warn(png_ptr, (sizeof *control)));

            if (control != NULL)
            {
               memset(control, 0, (sizeof *control));

               control->png_ptr = png_ptr;
               control->info_ptr = info_ptr;
               control->for_write = 0;

               image->opaque = control;
               return 1;
            }

            /* Error clean up */
            png_destroy_info_struct(png_ptr, &info_ptr);
         }

         png_destroy_read_struct(&png_ptr, NULL, NULL);
      }

      return png_image_error(image, "png_image_read: out of memory");
   }

   return png_image_error(image, "png_image_read: opaque pointer not NULL");
}